

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

String * __thiscall
capnp::compiler::ValueTranslator::makeTypeName
          (String *__return_storage_ptr__,ValueTranslator *this,Type type)

{
  Which WVar1;
  Schema SVar2;
  char (*params) [11];
  char (*in_R8) [2];
  Type local_60;
  Type local_50;
  String local_40;
  ValueTranslator *local_28;
  ValueTranslator *this_local;
  Type type_local;
  
  type_local._0_8_ = type.field_4;
  this_local = type._0_8_;
  local_28 = this;
  type_local.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)__return_storage_ptr__;
  WVar1 = capnp::Type::which((Type *)&this_local);
  switch(WVar1) {
  case VOID:
    kj::str<char_const(&)[5]>(__return_storage_ptr__,(kj *)"Void",(char (*) [5])params);
    break;
  case BOOL:
    kj::str<char_const(&)[5]>(__return_storage_ptr__,(kj *)"Bool",(char (*) [5])params);
    break;
  case INT8:
    kj::str<char_const(&)[5]>(__return_storage_ptr__,(kj *)0x3ac841,(char (*) [5])params);
    break;
  case INT16:
    kj::str<char_const(&)[6]>(__return_storage_ptr__,(kj *)0x3ac847,(char (*) [6])params);
    break;
  case INT32:
    kj::str<char_const(&)[6]>(__return_storage_ptr__,(kj *)0x3ac84e,(char (*) [6])params);
    break;
  case INT64:
    kj::str<char_const(&)[6]>(__return_storage_ptr__,(kj *)0x3ac855,(char (*) [6])params);
    break;
  case UINT8:
    kj::str<char_const(&)[6]>(__return_storage_ptr__,(kj *)"UInt8",(char (*) [6])params);
    break;
  case UINT16:
    kj::str<char_const(&)[7]>(__return_storage_ptr__,(kj *)"UInt16",(char (*) [7])params);
    break;
  case UINT32:
    kj::str<char_const(&)[7]>(__return_storage_ptr__,(kj *)"UInt32",(char (*) [7])params);
    break;
  case UINT64:
    kj::str<char_const(&)[7]>(__return_storage_ptr__,(kj *)"UInt64",(char (*) [7])params);
    break;
  case FLOAT32:
    kj::str<char_const(&)[8]>(__return_storage_ptr__,(kj *)"Float32",(char (*) [8])params);
    break;
  case FLOAT64:
    kj::str<char_const(&)[8]>(__return_storage_ptr__,(kj *)"Float64",(char (*) [8])params);
    break;
  case TEXT:
    kj::str<char_const(&)[5]>(__return_storage_ptr__,(kj *)"Text",(char (*) [5])params);
    break;
  case DATA:
    kj::str<char_const(&)[5]>(__return_storage_ptr__,(kj *)"Data",(char (*) [5])params);
    break;
  case LIST:
    local_60 = (Type)capnp::Type::asList((Type *)&this_local);
    local_50 = ListSchema::getElementType((ListSchema *)&local_60);
    makeTypeName(&local_40,this,local_50);
    kj::str<char_const(&)[6],kj::String,char_const(&)[2]>
              (__return_storage_ptr__,(kj *)"List(",(char (*) [6])&local_40,(String *)0x3a5081,in_R8
              );
    kj::String::~String(&local_40);
    break;
  case ENUM:
    SVar2.raw = (RawBrandedSchema *)capnp::Type::asEnum((Type *)&this_local);
    makeNodeName(__return_storage_ptr__,this,SVar2);
    break;
  case STRUCT:
    SVar2.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)&this_local);
    makeNodeName(__return_storage_ptr__,this,SVar2);
    break;
  case INTERFACE:
    SVar2.raw = (RawBrandedSchema *)capnp::Type::asInterface((Type *)&this_local);
    makeNodeName(__return_storage_ptr__,this,SVar2);
    break;
  case ANY_POINTER:
    kj::str<char_const(&)[11]>(__return_storage_ptr__,(kj *)0x3bfa20,params);
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String ValueTranslator::makeTypeName(Type type) {
  switch (type.which()) {
    case schema::Type::VOID: return kj::str("Void");
    case schema::Type::BOOL: return kj::str("Bool");
    case schema::Type::INT8: return kj::str("Int8");
    case schema::Type::INT16: return kj::str("Int16");
    case schema::Type::INT32: return kj::str("Int32");
    case schema::Type::INT64: return kj::str("Int64");
    case schema::Type::UINT8: return kj::str("UInt8");
    case schema::Type::UINT16: return kj::str("UInt16");
    case schema::Type::UINT32: return kj::str("UInt32");
    case schema::Type::UINT64: return kj::str("UInt64");
    case schema::Type::FLOAT32: return kj::str("Float32");
    case schema::Type::FLOAT64: return kj::str("Float64");
    case schema::Type::TEXT: return kj::str("Text");
    case schema::Type::DATA: return kj::str("Data");
    case schema::Type::LIST:
      return kj::str("List(", makeTypeName(type.asList().getElementType()), ")");
    case schema::Type::ENUM: return makeNodeName(type.asEnum());
    case schema::Type::STRUCT: return makeNodeName(type.asStruct());
    case schema::Type::INTERFACE: return makeNodeName(type.asInterface());
    case schema::Type::ANY_POINTER: return kj::str("AnyPointer");
  }
  KJ_UNREACHABLE;
}